

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AttributeSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Symbol_const&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,Symbol *args_2,ExpressionSyntax *args_3)

{
  string_view name;
  AttributeSymbol *this_00;
  ExpressionSyntax *args_local_3;
  Symbol *args_local_2;
  SourceLocation *args_local_1;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (AttributeSymbol *)allocate(this,0x70,8);
  name._M_len = args->_M_len;
  name._M_str = args->_M_str;
  ast::AttributeSymbol::AttributeSymbol(this_00,name,*args_1,args_2,args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }